

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

bool GlobOpt::CompareCurrentTypesWithExpectedTypes
               (JsTypeValueInfo *valueInfo,PropertySymOpnd *propertySymOpnd)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  EquivalentTypeSet *pEVar4;
  undefined4 *puVar5;
  JITTypeHolder JVar6;
  EquivalentTypeSet *rightTypeSet;
  bool local_d1;
  bool local_bc;
  bool local_bb;
  uint16 local_a2;
  nullptr_t pvStack_a0;
  uint16 checkedTypeSetIndex;
  JITTypeHolderBase<void> local_98;
  EquivalentTypeSet *local_90;
  EquivalentTypeSet *opndTypeSet;
  Type local_80;
  EquivalentTypeSet *local_78;
  EquivalentTypeSet *valueTypeSet;
  JITTypeHolderBase<void> local_68;
  JITTypeHolderBase<void> local_60;
  JITTypeHolderBase<void> local_58;
  nullptr_t local_50;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder local_40;
  JITTypeHolder opndType;
  JITTypeHolderBase<void> local_30;
  byte local_21;
  PropertySymOpnd *pPStack_20;
  bool isTypeDead;
  PropertySymOpnd *propertySymOpnd_local;
  JsTypeValueInfo *valueInfo_local;
  
  pPStack_20 = propertySymOpnd;
  propertySymOpnd_local = (PropertySymOpnd *)valueInfo;
  local_21 = IR::PropertySymOpnd::IsTypeDead(propertySymOpnd);
  bVar3 = true;
  if (propertySymOpnd_local != (PropertySymOpnd *)0x0) {
    local_30.t = (Type)JsTypeValueInfo::GetJsType((JsTypeValueInfo *)propertySymOpnd_local);
    opndType.t = (Type)0x0;
    bVar2 = JITTypeHolderBase<void>::operator==(&local_30,&opndType.t);
    bVar3 = false;
    if (bVar2) {
      pEVar4 = JsTypeValueInfo::GetJsTypeSet((JsTypeValueInfo *)propertySymOpnd_local);
      bVar3 = pEVar4 == (EquivalentTypeSet *)0x0;
    }
  }
  if (bVar3) {
    valueInfo_local._7_1_ = (bool)((local_21 ^ 0xff) & 1);
  }
  else {
    bVar3 = IR::PropertySymOpnd::HasEquivalentTypeSet(pPStack_20);
    if ((!bVar3) || (bVar3 = IR::PropertySymOpnd::NeedsMonoCheck(pPStack_20), bVar3)) {
      local_40 = IR::PropertySymOpnd::GetType(pPStack_20);
      local_48.t = (Type)JsTypeValueInfo::GetJsType((JsTypeValueInfo *)propertySymOpnd_local);
      local_50 = (nullptr_t)0x0;
      bVar3 = JITTypeHolderBase<void>::operator!=(&local_48,&local_50);
      if (bVar3) {
        local_58.t = (Type)JsTypeValueInfo::GetJsType((JsTypeValueInfo *)propertySymOpnd_local);
        local_60.t = (Type)IR::PropertySymOpnd::GetType(pPStack_20);
        bVar3 = JITTypeHolderBase<void>::operator==(&local_58,&local_60);
        if (bVar3) {
          valueInfo_local._7_1_ = true;
        }
        else {
          bVar3 = IR::PropertySymOpnd::HasInitialType(pPStack_20);
          local_bb = false;
          if (bVar3) {
            local_68.t = (Type)JsTypeValueInfo::GetJsType((JsTypeValueInfo *)propertySymOpnd_local);
            valueTypeSet = (EquivalentTypeSet *)IR::PropertySymOpnd::GetInitialType(pPStack_20);
            local_bb = JITTypeHolderBase<void>::operator==
                                 (&local_68,(JITTypeHolderBase<void> *)&valueTypeSet);
          }
          if (local_bb == false) {
            valueInfo_local._7_1_ = false;
          }
          else {
            valueInfo_local._7_1_ = (bool)((local_21 ^ 0xff) & 1);
          }
        }
      }
      else {
        pEVar4 = JsTypeValueInfo::GetJsTypeSet((JsTypeValueInfo *)propertySymOpnd_local);
        if (pEVar4 == (EquivalentTypeSet *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x449,"(valueInfo->GetJsTypeSet())","valueInfo->GetJsTypeSet()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        local_78 = JsTypeValueInfo::GetJsTypeSet((JsTypeValueInfo *)propertySymOpnd_local);
        local_80 = local_40.t;
        bVar3 = Js::EquivalentTypeSet::Contains(local_78,local_40,(uint16 *)0x0);
        if (bVar3) {
          valueInfo_local._7_1_ = (bool)((local_21 ^ 0xff) & 1);
        }
        else {
          bVar3 = IR::PropertySymOpnd::HasInitialType(pPStack_20);
          pEVar4 = local_78;
          local_bc = false;
          if (bVar3) {
            opndTypeSet = (EquivalentTypeSet *)IR::PropertySymOpnd::GetInitialType(pPStack_20);
            local_bc = Js::EquivalentTypeSet::Contains
                                 (pEVar4,(JITTypeHolder)opndTypeSet,(uint16 *)0x0);
          }
          if (local_bc == false) {
            valueInfo_local._7_1_ = false;
          }
          else {
            valueInfo_local._7_1_ = (bool)((local_21 ^ 0xff) & 1);
          }
        }
      }
    }
    else {
      local_90 = IR::PropertySymOpnd::GetEquivalentTypeSet(pPStack_20);
      local_98.t = (Type)JsTypeValueInfo::GetJsType((JsTypeValueInfo *)propertySymOpnd_local);
      pvStack_a0 = (nullptr_t)0x0;
      bVar3 = JITTypeHolderBase<void>::operator!=(&local_98,&stack0xffffffffffffff60);
      pEVar4 = local_90;
      if (bVar3) {
        JVar6 = JsTypeValueInfo::GetJsType((JsTypeValueInfo *)propertySymOpnd_local);
        bVar3 = Js::EquivalentTypeSet::Contains(pEVar4,JVar6,&local_a2);
        if (bVar3) {
          valueInfo_local._7_1_ = true;
        }
        else {
          valueInfo_local._7_1_ = false;
        }
      }
      else {
        pEVar4 = JsTypeValueInfo::GetJsTypeSet((JsTypeValueInfo *)propertySymOpnd_local);
        bVar3 = IsSubsetOf(pEVar4,local_90);
        if (bVar3) {
          valueInfo_local._7_1_ = true;
        }
        else {
          bVar3 = IR::PropertySymOpnd::IsMono(pPStack_20);
          pEVar4 = local_90;
          if (bVar3) {
            pEVar4 = JsTypeValueInfo::GetJsTypeSet((JsTypeValueInfo *)propertySymOpnd_local);
            JVar6 = IR::PropertySymOpnd::GetFirstEquivalentType(pPStack_20);
            local_d1 = Js::EquivalentTypeSet::Contains(pEVar4,JVar6,(uint16 *)0x0);
          }
          else {
            rightTypeSet = JsTypeValueInfo::GetJsTypeSet((JsTypeValueInfo *)propertySymOpnd_local);
            local_d1 = IsSubsetOf(pEVar4,rightTypeSet);
          }
          if (local_d1 == false) {
            valueInfo_local._7_1_ = false;
          }
          else {
            valueInfo_local._7_1_ = true;
          }
        }
      }
    }
  }
  return valueInfo_local._7_1_;
}

Assistant:

bool
GlobOpt::CompareCurrentTypesWithExpectedTypes(JsTypeValueInfo *valueInfo, IR::PropertySymOpnd * propertySymOpnd)
{
    bool isTypeDead = propertySymOpnd->IsTypeDead();

    if (valueInfo == nullptr || (valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr))
    {
        // No upstream types. Do a type check.
        return !isTypeDead;
    }

    if (!propertySymOpnd->HasEquivalentTypeSet() || propertySymOpnd->NeedsMonoCheck())
    {
        JITTypeHolder opndType = propertySymOpnd->GetType();

        if (valueInfo->GetJsType() != nullptr)
        {
            if (valueInfo->GetJsType() == propertySymOpnd->GetType())
            {
                return true;
            }
            if (propertySymOpnd->HasInitialType() && valueInfo->GetJsType() == propertySymOpnd->GetInitialType())
            {
                return !isTypeDead;
            }
            return false;
        }
        else
        {
            Assert(valueInfo->GetJsTypeSet());
            Js::EquivalentTypeSet *valueTypeSet = valueInfo->GetJsTypeSet();

            if (valueTypeSet->Contains(opndType))
            {
                return !isTypeDead;
            }
            if (propertySymOpnd->HasInitialType() && valueTypeSet->Contains(propertySymOpnd->GetInitialType()))
            {
                return !isTypeDead;
            }
            return false;
        }
    }
    else
    {
        Js::EquivalentTypeSet * opndTypeSet = propertySymOpnd->GetEquivalentTypeSet();

        if (valueInfo->GetJsType() != nullptr)
        {
            uint16 checkedTypeSetIndex;
            if (opndTypeSet->Contains(valueInfo->GetJsType(), &checkedTypeSetIndex))
            {
                return true;
            }
            return false;
        }
        else
        {
            if (IsSubsetOf(valueInfo->GetJsTypeSet(), opndTypeSet))
            {
                return true;
            }
            if (propertySymOpnd->IsMono() ?
                    valueInfo->GetJsTypeSet()->Contains(propertySymOpnd->GetFirstEquivalentType()) :
                    IsSubsetOf(opndTypeSet, valueInfo->GetJsTypeSet()))
            {
                return true;
            }
            return false;
        }
    }
}